

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Lazy<void> use_aspects(void)

{
  undefined8 *puVar1;
  LazyBase<void,_false> in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x1650,(nothrow_t *)&std::nothrow);
  if (puVar1 == (undefined8 *)0x0) {
    *(undefined8 *)in_RDI._coro.__handle_ = 0;
  }
  else {
    *puVar1 = use_aspects;
    puVar1[1] = use_aspects;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
    *(undefined8 **)in_RDI._coro.__handle_ = puVar1;
    *(undefined1 *)(puVar1 + 0x2c9) = 0;
  }
  return (Lazy<void>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<void> use_aspects() {
  coro_http_server server(1, 9001);
  server.set_http_handler<GET>(
      "/get",
      [](coro_http_request &req, coro_http_response &resp) {
        auto &val = req.get_aspect_data();
        assert(val[0] == "hello world");
        resp.set_status_and_content(status_type::ok, "ok");
      },
      log_t{}, get_data{});

  server.async_start();
  std::this_thread::sleep_for(300ms);  // wait for server start

  coro_http_client client{};
  auto result = co_await client.async_get("http://127.0.0.1:9001/get");
  assert(result.status == 200);

  co_return;
}